

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugInfoEntry.cpp
# Opt level: O2

bool __thiscall
llvm::DWARFDebugInfoEntry::extractFast
          (DWARFDebugInfoEntry *this,DWARFUnit *U,uint64_t *OffsetPtr,
          DWARFDataExtractor *DebugInfoData,uint64_t UEndOffset,uint32_t D)

{
  ulong uVar1;
  bool bVar2;
  uint64_t uVar3;
  DWARFAbbreviationDeclarationSet *this_00;
  DWARFAbbreviationDeclaration *this_01;
  unsigned_long *puVar4;
  long *plVar5;
  long lVar6;
  AttributeSpec *AttrSpec;
  AttributeSpec *this_02;
  Optional<unsigned_long> OVar7;
  Optional<long> OVar8;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 local_40;
  Optional<unsigned_long> FixedSize;
  
  uVar1 = *OffsetPtr;
  this->Offset = uVar1;
  this->Depth = D;
  if (UEndOffset <= uVar1) {
    return false;
  }
  if ((DebugInfoData->super_DataExtractor).Data.Length <= uVar1) {
    return false;
  }
  uVar3 = DataExtractor::getULEB128(&DebugInfoData->super_DataExtractor,OffsetPtr,(Error *)0x0);
  if (uVar3 == 0) {
    this->AbbrevDecl = (DWARFAbbreviationDeclaration *)0x0;
LAB_00b3259e:
    bVar2 = true;
  }
  else {
    this_00 = DWARFUnit::getAbbreviations(U);
    if (this_00 == (DWARFAbbreviationDeclarationSet *)0x0) {
      this->AbbrevDecl = (DWARFAbbreviationDeclaration *)0x0;
    }
    else {
      this_01 = DWARFAbbreviationDeclarationSet::getAbbreviationDeclaration(this_00,(uint32_t)uVar3)
      ;
      this->AbbrevDecl = this_01;
      if (this_01 != (DWARFAbbreviationDeclaration *)0x0) {
        OVar7 = DWARFAbbreviationDeclaration::getFixedAttributesByteSize(this_01,U);
        local_40 = OVar7.Storage.field_0;
        FixedSize.Storage.field_0.empty = OVar7.Storage.hasVal;
        if (((undefined1  [16])OVar7.Storage & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          this_02 = (AttributeSpec *)
                    (this->AbbrevDecl->AttributeSpecs).
                    super_SmallVectorImpl<llvm::DWARFAbbreviationDeclaration::AttributeSpec>.
                    super_SmallVectorTemplateBase<llvm::DWARFAbbreviationDeclaration::AttributeSpec,_true>
                    .
                    super_SmallVectorTemplateCommon<llvm::DWARFAbbreviationDeclaration::AttributeSpec,_void>
                    .super_SmallVectorBase.BeginX;
          for (lVar6 = (ulong)(this->AbbrevDecl->AttributeSpecs).
                              super_SmallVectorImpl<llvm::DWARFAbbreviationDeclaration::AttributeSpec>
                              .
                              super_SmallVectorTemplateBase<llvm::DWARFAbbreviationDeclaration::AttributeSpec,_true>
                              .
                              super_SmallVectorTemplateCommon<llvm::DWARFAbbreviationDeclaration::AttributeSpec,_void>
                              .super_SmallVectorBase.Size << 4; lVar6 != 0; lVar6 = lVar6 + -0x10) {
            OVar8 = DWARFAbbreviationDeclaration::AttributeSpec::getByteSize(this_02,U);
            local_40.value = (unsigned_long)OVar8.Storage.field_0;
            FixedSize.Storage.field_0.empty = OVar8.Storage.hasVal;
            if (((undefined1  [16])OVar8.Storage & (undefined1  [16])0x1) == (undefined1  [16])0x0)
            {
              bVar2 = DWARFFormValue::skipValue
                                (this_02->Form,DebugInfoData->super_DataExtractor,OffsetPtr,
                                 (U->Header).FormParams);
              if (!bVar2) goto LAB_00b325a7;
            }
            else {
              plVar5 = optional_detail::OptionalStorage<long,_true>::getValue
                                 ((OptionalStorage<long,_true> *)&local_40);
              *OffsetPtr = *OffsetPtr + *plVar5;
            }
            this_02 = this_02 + 1;
          }
        }
        else {
          puVar4 = optional_detail::OptionalStorage<unsigned_long,_true>::getValue
                             ((OptionalStorage<unsigned_long,_true> *)&local_40);
          *OffsetPtr = *OffsetPtr + *puVar4;
        }
        goto LAB_00b3259e;
      }
    }
LAB_00b325a7:
    *OffsetPtr = this->Offset;
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool DWARFDebugInfoEntry::extractFast(const DWARFUnit &U, uint64_t *OffsetPtr,
                                      const DWARFDataExtractor &DebugInfoData,
                                      uint64_t UEndOffset, uint32_t D) {
  Offset = *OffsetPtr;
  Depth = D;
  if (Offset >= UEndOffset || !DebugInfoData.isValidOffset(Offset))
    return false;
  uint64_t AbbrCode = DebugInfoData.getULEB128(OffsetPtr);
  if (0 == AbbrCode) {
    // NULL debug tag entry.
    AbbrevDecl = nullptr;
    return true;
  }
  if (auto* Abbreviations = U.getAbbreviations()) { // XXX BINARYEN
    AbbrevDecl = Abbreviations->getAbbreviationDeclaration(AbbrCode);
  } else {
    AbbrevDecl = nullptr; // XXX BINARYEN
  }
  if (nullptr == AbbrevDecl) {
    // Restore the original offset.
    *OffsetPtr = Offset;
    return false;
  }
  // See if all attributes in this DIE have fixed byte sizes. If so, we can
  // just add this size to the offset to skip to the next DIE.
  if (Optional<size_t> FixedSize = AbbrevDecl->getFixedAttributesByteSize(U)) {
    *OffsetPtr += *FixedSize;
    return true;
  }

  // Skip all data in the .debug_info for the attributes
  for (const auto &AttrSpec : AbbrevDecl->attributes()) {
    // Check if this attribute has a fixed byte size.
    if (auto FixedSize = AttrSpec.getByteSize(U)) {
      // Attribute byte size if fixed, just add the size to the offset.
      *OffsetPtr += *FixedSize;
    } else if (!DWARFFormValue::skipValue(AttrSpec.Form, DebugInfoData,
                                          OffsetPtr, U.getFormParams())) {
      // We failed to skip this attribute's value, restore the original offset
      // and return the failure status.
      *OffsetPtr = Offset;
      return false;
    }
  }
  return true;
}